

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntegrationTest.cpp
# Opt level: O0

void initGlobals(int argc,char **argv)

{
  char *pcVar1;
  long in_RSI;
  int in_EDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  char *in_stack_fffffffffffffec8;
  allocator *__lhs;
  allocator local_fc;
  byte local_fb;
  byte local_fa;
  allocator local_f9;
  string local_f8 [32];
  string local_d8 [35];
  byte local_b5;
  allocator local_b4;
  byte local_b3;
  byte local_b2;
  allocator local_b1;
  string local_b0 [32];
  string local_90 [39];
  byte local_69;
  string local_68 [54];
  byte local_32;
  allocator local_31;
  string local_30 [32];
  long local_10;
  int local_4;
  
  local_32 = 0;
  local_69 = 0;
  local_10 = in_RSI;
  local_4 = in_EDI;
  if (in_EDI < 2) {
    extension_abi_cxx11_();
    local_69 = 1;
    std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  }
  else {
    pcVar1 = *(char **)(in_RSI + 8);
    std::allocator<char>::allocator();
    local_32 = 1;
    std::__cxx11::string::string(local_30,pcVar1,&local_31);
  }
  std::__cxx11::string::operator=((string *)g_bread_path_abi_cxx11_,local_30);
  std::__cxx11::string::~string(local_30);
  if ((local_69 & 1) != 0) {
    std::__cxx11::string::~string(local_68);
  }
  if ((local_32 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
  }
  local_b2 = 0;
  local_b3 = 0;
  local_b5 = 0;
  if (local_4 < 3) {
    std::allocator<char>::allocator();
    local_b5 = 1;
    std::__cxx11::string::string(local_90,"./",&local_b4);
  }
  else {
    std::allocator<char>::allocator();
    local_b2 = 1;
    std::__cxx11::string::string(local_b0,"/",&local_b1);
    local_b3 = 1;
    std::operator+(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  }
  std::__cxx11::string::operator=((string *)g_inttest_dir_abi_cxx11_,local_90);
  std::__cxx11::string::~string(local_90);
  if ((local_b5 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_b4);
  }
  if ((local_b3 & 1) != 0) {
    std::__cxx11::string::~string(local_b0);
  }
  if ((local_b2 & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  }
  local_fa = 0;
  local_fb = 0;
  if (local_4 < 4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"../test/integration/",&local_fc);
  }
  else {
    __rhs = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)(local_10 + 0x18)
    ;
    __lhs = &local_f9;
    std::allocator<char>::allocator();
    local_fa = 1;
    std::__cxx11::string::string(local_f8,"/test/integration/",__lhs);
    local_fb = 1;
    std::operator+((char *)__lhs,__rhs);
  }
  std::__cxx11::string::operator=((string *)g_src_dir_abi_cxx11_,local_d8);
  std::__cxx11::string::~string(local_d8);
  if (local_4 < 4) {
    std::allocator<char>::~allocator((allocator<char> *)&local_fc);
  }
  if ((local_fb & 1) != 0) {
    std::__cxx11::string::~string(local_f8);
  }
  if ((local_fa & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  }
  return;
}

Assistant:

void initGlobals(int argc, const char* argv[])
{
  g_bread_path = (argc > 1) ? argv[1] : "./bread" + extension();
  g_inttest_dir = (argc > 2) ? argv[2] + std::string("/") : "./";
  g_src_dir = (argc > 3) ? argv[3] + std::string("/test/integration/") : "../test/integration/";
}